

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

string * flatbuffers::anon_unknown_1::ToDasher(string *__return_storage_ptr__,string *input)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *c;
  size_t i;
  char p;
  string *input_local;
  string *s;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  i._6_1_ = '\0';
  c = (char *)0x0;
  do {
    pcVar2 = (char *)std::__cxx11::string::length();
    if (pcVar2 <= c) {
      return __return_storage_ptr__;
    }
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)input);
    if (*pcVar2 == '_') {
      if ((c != (char *)0x0) && (i._6_1_ != '/')) {
        pcVar3 = (char *)std::__cxx11::string::length();
        if (c + 1 < pcVar3) {
          pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)input);
          iVar1 = isdigit((int)*pcVar3);
          if (iVar1 != 0) goto LAB_001b44be;
        }
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"-");
      }
    }
    else {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar2);
    }
LAB_001b44be:
    i._6_1_ = *pcVar2;
    c = c + 1;
  } while( true );
}

Assistant:

std::string ToDasher(const std::string &input) {
  std::string s;
  char p = 0;
  for (size_t i = 0; i < input.length(); i++) {
    char const &c = input[i];
    if (c == '_') {
      if (i > 0 && p != kPathSeparator &&
          // The following is a special case to ignore digits after a _. This is
          // because ThisExample3 would be converted to this_example_3 in the
          // CamelToSnake conversion, and then dasher would do this-example-3,
          // but it expects this-example3.
          !(i + 1 < input.length() && isdigit(input[i + 1])))
        s += "-";
    } else {
      s += c;
    }
    p = c;
  }
  return s;
}